

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

ssize_t __thiscall
clask::response_writer::write(response_writer *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *local_38 [2];
  long local_28 [2];
  ssize_t sVar2;
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,CONCAT44(in_register_00000034,__fd),
             (long)__buf + CONCAT44(in_register_00000034,__fd));
  iVar1 = (**this->_vptr_response_writer)(this,local_38);
  sVar2 = CONCAT44(extraout_var,iVar1);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
    sVar2 = extraout_RAX;
  }
  return sVar2;
}

Assistant:

inline void response_writer::write(char* buf, size_t n) {
  write(std::string(buf, n));
}